

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O0

void __thiscall adiosStream::getADIOSArray(adiosStream *this,shared_ptr<VariableInfo> *ov)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  string *__y;
  char *pcVar4;
  long in_RDI;
  int *a_2;
  Variable<int> v_2;
  float *a_1;
  Variable<float> v_1;
  double *a;
  Variable<double> v;
  char *in_stack_fffffffffffffe98;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffea0;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb8;
  Dims *__x;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffec0;
  undefined8 local_b8;
  undefined8 local_b0;
  char *local_a8;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a0;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_18 [3];
  
  peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x134c9b);
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&peVar2->data);
  if (sVar3 == 0) {
    std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x134cba);
    std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x134ccf);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffec0,
               (size_type)in_stack_fffffffffffffeb8);
  }
  std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x134cea
            );
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (bVar1) {
    std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x134d1e);
    local_18[0] = adios2::IO::InquireVariable<double>((string *)(in_RDI + 0x38));
    bVar1 = adios2::Variable::operator_cast_to_bool((Variable *)local_18);
    if (bVar1) {
      std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x134d64);
      std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x134d77);
      std::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      adios2::Variable<double>::SetSelection((pair *)local_18);
      std::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::~pair(in_stack_fffffffffffffea0);
      std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x134dc3);
      local_60 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x134dd2);
      local_68 = local_18[0];
      adios2::Engine::Get<double>(in_RDI + 0x30,local_18[0],local_60,6);
      peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x134e17);
      peVar2->readFromInput = true;
    }
    else {
      peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x134d4e);
      peVar2->readFromInput = false;
    }
  }
  else {
    std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x134e53);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (bVar1) {
      std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x134e87);
      local_70 = adios2::IO::InquireVariable<float>((string *)(in_RDI + 0x38));
      bVar1 = adios2::Variable::operator_cast_to_bool((Variable *)&local_70);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134ecd);
        __x = &peVar2->start;
        std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x134ee0);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                  (&local_a0,__x,in_stack_fffffffffffffeb0);
        adios2::Variable<float>::SetSelection((pair *)&local_70);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(in_stack_fffffffffffffea0);
        std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x134f2c);
        local_a8 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x134f3b);
        local_b0 = local_70;
        adios2::Engine::Get<float>(in_RDI + 0x30,local_70,local_a8,6);
        peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134f80);
        peVar2->readFromInput = true;
      }
      else {
        peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134eb7);
        peVar2->readFromInput = false;
      }
    }
    else {
      std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x134fbc);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (bVar1) {
        __y = (string *)(in_RDI + 0x38);
        std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x134ff0);
        local_b8 = adios2::IO::InquireVariable<int>(__y);
        bVar1 = adios2::Variable::operator_cast_to_bool((Variable *)&local_b8);
        if (bVar1) {
          peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x135036);
          this_00 = (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)&peVar2->start;
          std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x135049);
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__y);
          adios2::Variable<int>::SetSelection((pair *)&local_b8);
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~pair(this_00);
          std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x135095);
          pcVar4 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x1350a4);
          adios2::Engine::Get<int>(in_RDI + 0x30,local_b8,pcVar4,6);
          peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1350dd);
          peVar2->readFromInput = true;
        }
        else {
          peVar2 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x135020);
          peVar2->readFromInput = false;
        }
      }
    }
  }
  return;
}

Assistant:

void adiosStream::getADIOSArray(std::shared_ptr<VariableInfo> ov)
{
    // Allocate memory on first access
    if (!ov->data.size())
    {
        ov->data.resize(ov->datasize);
    }
    if (ov->type == "double")
    {
        adios2::Variable<double> v = io.InquireVariable<double>(ov->name);
        if (!v)
        {
            ov->readFromInput = false;
            return;
        }
        v.SetSelection({ov->start, ov->count});
        double *a = reinterpret_cast<double *>(ov->data.data());
        engine.Get<double>(v, a);
        ov->readFromInput = true;
    }
    else if (ov->type == "float")
    {
        adios2::Variable<float> v = io.InquireVariable<float>(ov->name);
        if (!v)
        {
            ov->readFromInput = false;
            return;
        }
        v.SetSelection({ov->start, ov->count});
        float *a = reinterpret_cast<float *>(ov->data.data());
        engine.Get<float>(v, a);
        ov->readFromInput = true;
    }
    else if (ov->type == "int")
    {
        adios2::Variable<int> v = io.InquireVariable<int>(ov->name);
        if (!v)
        {
            ov->readFromInput = false;
            return;
        }
        v.SetSelection({ov->start, ov->count});
        int *a = reinterpret_cast<int *>(ov->data.data());
        engine.Get<int>(v, a);
        ov->readFromInput = true;
    }
}